

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scopes.cpp
# Opt level: O2

int main(void)

{
  i injector;
  injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,per_request,per_request_impl,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,shared,shared_impl,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
  local_2 [2];
  
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,per_request,per_request_impl,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,shared,shared_impl,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
  ::
  create_successful_impl__<boost::ext::di::v1_3_0::aux::integral_constant<bool,true>,example,boost::ext::di::v1_3_0::no_name>
            (local_2);
  return 0;
}

Assistant:

int main() {
  // clang-format off
  auto injector = di::make_injector(
    di::bind<per_request>().to<per_request_impl>().in(di::unique)
  , di::bind<shared>().to<shared_impl>().in(di::singleton)
  );
  // clang-format on

  /*<<create `example`>>*/
  injector.create<example>();
}